

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

vector<efsw::String,_std::allocator<efsw::String>_> *
efsw::String::split(vector<efsw::String,_std::allocator<efsw::String>_> *__return_storage_ptr__,
                   String *str,Uint32 *splitchar,bool *pushEmptyString)

{
  ulong uVar1;
  StringBaseType SVar2;
  size_t sVar3;
  StringBaseType local_8c;
  String local_88;
  ulong local_68;
  size_t i;
  undefined1 local_50 [8];
  String tmpstr;
  bool *pushEmptyString_local;
  Uint32 *splitchar_local;
  String *str_local;
  vector<efsw::String,_std::allocator<efsw::String>_> *tmp;
  
  tmpstr.mString.field_2._M_local_buf[3]._3_1_ = 0;
  std::vector<efsw::String,_std::allocator<efsw::String>_>::vector(__return_storage_ptr__);
  String((String *)local_50);
  for (local_68 = 0; uVar1 = local_68, sVar3 = size(str), uVar1 < sVar3; local_68 = local_68 + 1) {
    SVar2 = operator[](str,local_68);
    if (SVar2 == *splitchar) {
      if (((*pushEmptyString & 1U) != 0) || (sVar3 = size((String *)local_50), sVar3 != 0)) {
        std::vector<efsw::String,_std::allocator<efsw::String>_>::push_back
                  (__return_storage_ptr__,(value_type *)local_50);
        String(&local_88,"");
        operator=((String *)local_50,&local_88);
        ~String(&local_88);
      }
    }
    else {
      local_8c = operator[](str,local_68);
      operator+=((String *)local_50,&local_8c);
    }
  }
  sVar3 = size((String *)local_50);
  if (sVar3 != 0) {
    std::vector<efsw::String,_std::allocator<efsw::String>_>::push_back
              (__return_storage_ptr__,(value_type *)local_50);
  }
  tmpstr.mString.field_2._M_local_buf[3]._3_1_ = 1;
  ~String((String *)local_50);
  if ((tmpstr.mString.field_2._M_local_buf[3]._3_1_ & 1) == 0) {
    std::vector<efsw::String,_std::allocator<efsw::String>_>::~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector < String > String::split ( const String& str, const Uint32& splitchar, const bool& pushEmptyString )
{
	std::vector < String > tmp;
	String tmpstr;

	for ( size_t i = 0; i < str.size(); i++ )
	{
		if ( str[i] == splitchar )
		{
			if ( pushEmptyString || tmpstr.size() )
			{
				tmp.push_back(tmpstr);
				tmpstr = "";
			}
		}
		else
		{
			tmpstr += str[i];
		}
	}

	if ( tmpstr.size() )
	{
		tmp.push_back( tmpstr );
	}

	return tmp;
}